

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O0

void __thiscall
cuckoocache_tests::EraseTest::test_cache_erase<CuckooCache::cache<uint256,SignatureCacheHasher>>
          (EraseTest *this,size_t megabytes)

{
  uint256 e;
  uint256 e_00;
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  reference pvVar6;
  cache<uint256,_SignatureCacheHasher> *this_00;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  pair<unsigned_int,_unsigned_long> pVar8;
  double hit_rate_stale;
  double hit_rate_erased_but_contained;
  uint32_t i_6;
  uint32_t i_5;
  uint32_t i_4;
  size_t count_fresh;
  size_t count_stale;
  size_t count_erased_but_contained;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t i_1;
  uint8_t j;
  uint32_t *ptr;
  uint32_t i;
  uint32_t n_insert;
  size_t bytes;
  double load;
  double hit_rate_fresh;
  vector<uint256,_std::allocator<uint256>_> hashes_insert_copy;
  vector<uint256,_std::allocator<uint256>_> hashes;
  cache<uint256,_SignatureCacheHasher> set;
  char *in_stack_fffffffffffffcb8;
  lazy_ostream *in_stack_fffffffffffffcc0;
  assertion_result *in_stack_fffffffffffffcc8;
  size_type in_stack_fffffffffffffcd0;
  BasicTestingSetup *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  lazy_ostream *in_stack_fffffffffffffce8;
  cache<uint256,_SignatureCacheHasher> *in_stack_fffffffffffffcf0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffcf8;
  const_string *this_01;
  vector<uint256,_std::allocator<uint256>_> *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  uint local_2ac;
  uint local_2a8;
  uint local_2a4;
  long local_2a0;
  uint local_288;
  uint local_284;
  uint local_280;
  byte local_279;
  uint32_t *local_278;
  uint local_270;
  double dVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  iterator in_stack_fffffffffffffdd8;
  lazy_ostream local_208 [2];
  assertion_result local_1e8 [2];
  undefined1 local_1a8 [16];
  undefined1 local_198 [64];
  double local_158;
  const_string local_150 [2];
  lazy_ostream local_130 [2];
  assertion_result local_110 [8];
  cache<uint256,_SignatureCacheHasher> *local_48;
  lazy_ostream *plStack_40;
  assertion_result *local_38;
  undefined8 uStack_30;
  cache<uint256,_SignatureCacheHasher> *local_28;
  lazy_ostream *plStack_20;
  assertion_result *local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = (undefined4)in_RSI;
  uVar11 = (undefined4)((ulong)in_RSI >> 0x20);
  dVar9 = 1.0;
  BasicTestingSetup::SeedRandomForTest
            (in_stack_fffffffffffffcd8,(SeedRand)(in_stack_fffffffffffffcd0 >> 0x20));
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcb8);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache
            ((cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffcd8);
  lVar1 = CONCAT44(uVar11,uVar10);
  pVar8 = CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes
                    ((cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffcd8,
                     in_stack_fffffffffffffcd0);
  this_00 = (cache<uint256,_SignatureCacheHasher> *)pVar8.second;
  uVar5 = (ulong)(dVar9 * (double)((ulong)(lVar1 << 0x14) >> 5));
  uVar3 = (uint)uVar5;
  std::vector<uint256,_std::allocator<uint256>_>::resize
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcd8,
             in_stack_fffffffffffffcd0);
  for (local_270 = 0; local_270 < uVar3; local_270 = local_270 + 1) {
    std::vector<uint256,_std::allocator<uint256>_>::operator[]
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcc8,
               (size_type)in_stack_fffffffffffffcc0);
    local_278 = (uint32_t *)base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffcb8);
    for (local_279 = 0; local_279 < 8; local_279 = local_279 + 1) {
      uVar4 = RandomMixin<FastRandomContext>::rand32
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffcb8);
      *local_278 = uVar4;
      local_278 = local_278 + 1;
    }
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)
             CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),in_stack_fffffffffffffd08
            );
  for (local_280 = 0; local_280 < uVar3 >> 1; local_280 = local_280 + 1) {
    pvVar6 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcc8,
                        (size_type)in_stack_fffffffffffffcc0);
    in_stack_fffffffffffffcb8 = *(char **)(pvVar6->super_base_blob<256U>).m_data._M_elems;
    in_stack_fffffffffffffcc0 =
         *(lazy_ostream **)((pvVar6->super_base_blob<256U>).m_data._M_elems + 8);
    in_stack_fffffffffffffcc8 =
         *(assertion_result **)((pvVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
    uStack_10 = *(undefined8 *)((pvVar6->super_base_blob<256U>).m_data._M_elems + 0x18);
    e.super_base_blob<256U>.m_data._M_elems[8] = (char)uVar10;
    e.super_base_blob<256U>.m_data._M_elems[9] = (char)((uint)uVar10 >> 8);
    e.super_base_blob<256U>.m_data._M_elems[10] = (char)((uint)uVar10 >> 0x10);
    e.super_base_blob<256U>.m_data._M_elems[0xb] = (char)((uint)uVar10 >> 0x18);
    e.super_base_blob<256U>.m_data._M_elems._0_8_ = dVar9;
    e.super_base_blob<256U>.m_data._M_elems[0xc] = (char)uVar11;
    e.super_base_blob<256U>.m_data._M_elems[0xd] = (char)((uint)uVar11 >> 8);
    e.super_base_blob<256U>.m_data._M_elems[0xe] = (char)((uint)uVar11 >> 0x10);
    e.super_base_blob<256U>.m_data._M_elems[0xf] = (char)((uint)uVar11 >> 0x18);
    e.super_base_blob<256U>.m_data._M_elems[0x10] = (char)in_RDI;
    e.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)in_RDI >> 8);
    e.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)in_RDI >> 0x10);
    e.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)in_RDI >> 0x18);
    e.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)in_RDI >> 0x20);
    e.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)in_RDI >> 0x28);
    e.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)in_RDI >> 0x30);
    e.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)in_RDI >> 0x38);
    e.super_base_blob<256U>.m_data._M_elems._24_8_ = in_stack_fffffffffffffdd8;
    local_28 = (cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffcb8;
    plStack_20 = in_stack_fffffffffffffcc0;
    local_18 = in_stack_fffffffffffffcc8;
    CuckooCache::cache<uint256,_SignatureCacheHasher>::insert(this_00,e);
  }
  for (local_284 = 0; local_284 < uVar3 >> 2; local_284 = local_284 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcc8,
                 (pointer)in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcb8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffcf8,(const_string *)in_stack_fffffffffffffcf0,
                 (size_t)in_stack_fffffffffffffce8,
                 (const_string *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
      std::vector<uint256,_std::allocator<uint256>_>::operator[]
                ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcc8,
                 (size_type)in_stack_fffffffffffffcc0);
      CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                (in_stack_fffffffffffffcf0,(uint256 *)in_stack_fffffffffffffce8,
                 (bool)in_stack_fffffffffffffce7);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffcc8,SUB81((ulong)in_stack_fffffffffffffcc0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcc8,
                 (pointer)in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
      boost::unit_test::operator<<
                (in_stack_fffffffffffffcc0,(basic_cstring<const_char> *)in_stack_fffffffffffffcb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcc8,
                 (pointer)in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
      in_stack_fffffffffffffcb8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_110,local_130,local_150,0x9b,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffcb8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffcb8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  for (local_288 = uVar3 >> 1; local_288 < uVar3; local_288 = local_288 + 1) {
    pvVar6 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcc8,
                        (size_type)in_stack_fffffffffffffcc0);
    in_stack_fffffffffffffcb8 = *(char **)(pvVar6->super_base_blob<256U>).m_data._M_elems;
    in_stack_fffffffffffffcc0 =
         *(lazy_ostream **)((pvVar6->super_base_blob<256U>).m_data._M_elems + 8);
    in_stack_fffffffffffffcc8 =
         *(assertion_result **)((pvVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
    uStack_30 = *(undefined8 *)((pvVar6->super_base_blob<256U>).m_data._M_elems + 0x18);
    e_00.super_base_blob<256U>.m_data._M_elems[8] = (char)uVar10;
    e_00.super_base_blob<256U>.m_data._M_elems[9] = (char)((uint)uVar10 >> 8);
    e_00.super_base_blob<256U>.m_data._M_elems[10] = (char)((uint)uVar10 >> 0x10);
    e_00.super_base_blob<256U>.m_data._M_elems[0xb] = (char)((uint)uVar10 >> 0x18);
    e_00.super_base_blob<256U>.m_data._M_elems._0_8_ = dVar9;
    e_00.super_base_blob<256U>.m_data._M_elems[0xc] = (char)uVar11;
    e_00.super_base_blob<256U>.m_data._M_elems[0xd] = (char)((uint)uVar11 >> 8);
    e_00.super_base_blob<256U>.m_data._M_elems[0xe] = (char)((uint)uVar11 >> 0x10);
    e_00.super_base_blob<256U>.m_data._M_elems[0xf] = (char)((uint)uVar11 >> 0x18);
    e_00.super_base_blob<256U>.m_data._M_elems[0x10] = (char)in_RDI;
    e_00.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)in_RDI >> 8);
    e_00.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)in_RDI >> 0x10);
    e_00.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)in_RDI >> 0x18);
    e_00.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)in_RDI >> 0x20);
    e_00.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)in_RDI >> 0x28);
    e_00.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)in_RDI >> 0x30);
    e_00.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)in_RDI >> 0x38);
    e_00.super_base_blob<256U>.m_data._M_elems._24_8_ = in_stack_fffffffffffffdd8;
    local_48 = (cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffcb8;
    plStack_40 = in_stack_fffffffffffffcc0;
    local_38 = in_stack_fffffffffffffcc8;
    CuckooCache::cache<uint256,_SignatureCacheHasher>::insert(this_00,e_00);
  }
  local_2a0 = 0;
  for (local_2a4 = 0; local_2a4 < uVar3 >> 2; local_2a4 = local_2a4 + 1) {
    std::vector<uint256,_std::allocator<uint256>_>::operator[]
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcc8,
               (size_type)in_stack_fffffffffffffcc0);
    CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
              (in_stack_fffffffffffffcf0,(uint256 *)in_stack_fffffffffffffce8,
               (bool)in_stack_fffffffffffffce7);
  }
  for (local_2a8 = uVar3 >> 2; local_2a8 < uVar3 >> 1; local_2a8 = local_2a8 + 1) {
    std::vector<uint256,_std::allocator<uint256>_>::operator[]
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcc8,
               (size_type)in_stack_fffffffffffffcc0);
    CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
              (in_stack_fffffffffffffcf0,(uint256 *)in_stack_fffffffffffffce8,
               (bool)in_stack_fffffffffffffce7);
  }
  for (local_2ac = uVar3 >> 1; local_2ac < uVar3; local_2ac = local_2ac + 1) {
    std::vector<uint256,_std::allocator<uint256>_>::operator[]
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcc8,
               (size_type)in_stack_fffffffffffffcc0);
    bVar2 = CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                      (in_stack_fffffffffffffcf0,(uint256 *)in_stack_fffffffffffffce8,
                       (bool)in_stack_fffffffffffffce7);
    local_2a0 = (ulong)bVar2 + local_2a0;
  }
  auVar7._8_4_ = (int)((ulong)local_2a0 >> 0x20);
  auVar7._0_8_ = local_2a0;
  auVar7._12_4_ = 0x45300000;
  local_158 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_2a0) - 4503599627370496.0)) /
              ((double)(uVar5 & 0xffffffff) / 2.0);
  do {
    this_01 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcc8,
               (pointer)in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_01,(const_string *)in_stack_fffffffffffffcf0,
               (size_t)in_stack_fffffffffffffce8,
               (const_string *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffcc0,(char (*) [1])in_stack_fffffffffffffcb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcc8,
               (pointer)in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffcc8 = (assertion_result *)0x1e75e55;
    in_stack_fffffffffffffcc0 = (lazy_ostream *)&stack0xfffffffffffffe50;
    in_stack_fffffffffffffcb8 = "hit_rate_fresh";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_198,local_1a8,0xb3,1,2,&local_158);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcc8,
               (pointer)in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_01,file,(size_t)in_stack_fffffffffffffce8,
               (const_string *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffcc8,SUB81((ulong)in_stack_fffffffffffffcc0 >> 0x38,0));
    in_stack_fffffffffffffce8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcc8,
               (pointer)in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffcc0,(basic_cstring<const_char> *)in_stack_fffffffffffffcb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcc8,
               (pointer)in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffcb8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e8,local_208,(const_string *)&stack0xfffffffffffffdd8,0xb6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffcb8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffcb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcc8);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::~cache
            ((cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffcb8);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcc8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void test_cache_erase(size_t megabytes)
{
    double load = 1;
    SeedRandomForTest(SeedRand::ZEROS);
    std::vector<uint256> hashes;
    Cache set{};
    size_t bytes = megabytes * (1 << 20);
    set.setup_bytes(bytes);
    uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));
    hashes.resize(n_insert);
    for (uint32_t i = 0; i < n_insert; ++i) {
        uint32_t* ptr = (uint32_t*)hashes[i].begin();
        for (uint8_t j = 0; j < 8; ++j)
            *(ptr++) = m_rng.rand32();
    }
    /** We make a copy of the hashes because future optimizations of the
     * cuckoocache may overwrite the inserted element, so the test is
     * "future proofed".
     */
    std::vector<uint256> hashes_insert_copy = hashes;

    /** Insert the first half */
    for (uint32_t i = 0; i < (n_insert / 2); ++i)
        set.insert(hashes_insert_copy[i]);
    /** Erase the first quarter */
    for (uint32_t i = 0; i < (n_insert / 4); ++i)
        BOOST_CHECK(set.contains(hashes[i], true));
    /** Insert the second half */
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        set.insert(hashes_insert_copy[i]);

    /** elements that we marked as erased but are still there */
    size_t count_erased_but_contained = 0;
    /** elements that we did not erase but are older */
    size_t count_stale = 0;
    /** elements that were most recently inserted */
    size_t count_fresh = 0;

    for (uint32_t i = 0; i < (n_insert / 4); ++i)
        count_erased_but_contained += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 4); i < (n_insert / 2); ++i)
        count_stale += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        count_fresh += set.contains(hashes[i], false);

    double hit_rate_erased_but_contained = double(count_erased_but_contained) / (double(n_insert) / 4.0);
    double hit_rate_stale = double(count_stale) / (double(n_insert) / 4.0);
    double hit_rate_fresh = double(count_fresh) / (double(n_insert) / 2.0);

    // Check that our hit_rate_fresh is perfect
    BOOST_CHECK_EQUAL(hit_rate_fresh, 1.0);
    // Check that we have a more than 2x better hit rate on stale elements than
    // erased elements.
    BOOST_CHECK(hit_rate_stale > 2 * hit_rate_erased_but_contained);
}